

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4h *value)

{
  bool bVar1;
  half hVar2;
  float4 v;
  array<float,_4UL> local_20;
  
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,&local_20);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[0]);
    (value->r).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[1]);
    (value->g).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[2]);
    (value->b).value = hVar2.value;
    hVar2 = tinyusdz::value::float_to_half_full(local_20._M_elems[3]);
    (value->a).value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4h *value) {
  // parse as float4
  value::float4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = value::float_to_half_full(v[0]);
    value->g = value::float_to_half_full(v[1]);
    value->b = value::float_to_half_full(v[2]);
    value->a = value::float_to_half_full(v[3]);
    return true;
  }
  return false;
}